

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportBuildFileGenerator::GenerateImportTargetsConfig
          (cmExportBuildFileGenerator *this,ostream *os,string *config,string *suffix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  pointer ppcVar1;
  cmGeneratorTarget *target;
  TargetType TVar2;
  cmExportBuildFileGenerator *this_00;
  pointer ppcVar3;
  ImportPropertyMap properties;
  
  ppcVar1 = (this->Exports).
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar3 = (this->Exports).
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppcVar3 != ppcVar1; ppcVar3 = ppcVar3 + 1
      ) {
    target = *ppcVar3;
    properties._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    properties._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    properties._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &properties._M_t._M_impl.super__Rb_tree_header._M_header;
    properties._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_00 = this;
    properties._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         properties._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    TVar2 = GetExportTargetType(this,target);
    if (TVar2 != INTERFACE_LIBRARY) {
      SetImportLocationProperty(this_00,config,suffix,target,(ImportPropertyMap *)&properties._M_t);
    }
    if (properties._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      TVar2 = GetExportTargetType(this,target);
      if (TVar2 != INTERFACE_LIBRARY) {
        cmExportFileGenerator::SetImportDetailProperties
                  (&this->super_cmExportFileGenerator,config,suffix,target,
                   (ImportPropertyMap *)&properties._M_t,missingTargets);
        cmExportFileGenerator::SetImportLinkInterface
                  (&this->super_cmExportFileGenerator,config,suffix,BuildInterface,target,
                   (ImportPropertyMap *)&properties._M_t,missingTargets);
      }
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[7])
                (this,os,config,target,&properties._M_t);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&properties._M_t);
  }
  return;
}

Assistant:

void cmExportBuildFileGenerator::GenerateImportTargetsConfig(
  std::ostream& os, const std::string& config, std::string const& suffix,
  std::vector<std::string>& missingTargets)
{
  for (cmGeneratorTarget* target : this->Exports) {
    // Collect import properties for this target.
    ImportPropertyMap properties;

    if (this->GetExportTargetType(target) != cmStateEnums::INTERFACE_LIBRARY) {
      this->SetImportLocationProperty(config, suffix, target, properties);
    }
    if (!properties.empty()) {
      // Get the rest of the target details.
      if (this->GetExportTargetType(target) !=
          cmStateEnums::INTERFACE_LIBRARY) {
        this->SetImportDetailProperties(config, suffix, target, properties,
                                        missingTargets);
        this->SetImportLinkInterface(config, suffix,
                                     cmGeneratorExpression::BuildInterface,
                                     target, properties, missingTargets);
      }

      // TODO: PUBLIC_HEADER_LOCATION
      // This should wait until the build feature propagation stuff
      // is done.  Then this can be a propagated include directory.
      // this->GenerateImportProperty(config, te->HeaderGenerator,
      //                              properties);

      // Generate code in the export file.
      this->GenerateImportPropertyCode(os, config, target, properties);
    }
  }
}